

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O0

int dowhatisinv(obj *obj)

{
  char *inp;
  obj *local_18;
  obj *obj_local;
  
  local_18 = obj;
  if (obj == (obj *)0x0) {
    local_18 = getobj("\x14","examine",(obj **)0x0);
  }
  if ((local_18 != (obj *)0x0) && (local_18 != &zeroobj)) {
    inp = database_oname(local_18);
    checkfile(inp,(permonst *)0x0,'\x01','\x01');
  }
  return 0;
}

Assistant:

int dowhatisinv(struct obj *obj)
{
	static const char allowall[] = { ALL_CLASSES, 0 };

	if (!obj)
	    obj = getobj(allowall, "examine", NULL);
	if (!obj || obj == &zeroobj)
	    return 0;

	/* Fake user_typed_name for feedback on failure to find an entry. */
	checkfile(database_oname(obj), NULL, TRUE, TRUE);

	return 0;
}